

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::ClipperOffset::OffsetPoint(ClipperOffset *this,int j,int *k,JoinType jointype)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  reference pvVar5;
  reference pvVar6;
  cInt cVar7;
  cInt cVar8;
  double r;
  IntPoint local_50;
  IntPoint local_40;
  double local_30;
  double cosA;
  int *piStack_20;
  JoinType jointype_local;
  int *k_local;
  ClipperOffset *pCStack_10;
  int j_local;
  ClipperOffset *this_local;
  
  cosA._4_4_ = jointype;
  piStack_20 = k;
  k_local._4_4_ = j;
  pCStack_10 = this;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)*k);
  dVar1 = pvVar5->X;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)k_local._4_4_);
  dVar2 = pvVar5->Y;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)k_local._4_4_);
  dVar3 = pvVar5->X;
  pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->m_normals,(long)*piStack_20);
  this->m_sinA = dVar1 * dVar2 + -(dVar3 * pvVar5->Y);
  if (1.0 <= ABS(this->m_sinA * this->m_delta)) {
    if (this->m_sinA <= 1.0) {
      if (this->m_sinA <= -1.0 && this->m_sinA != -1.0) {
        this->m_sinA = -1.0;
      }
    }
    else {
      this->m_sinA = 1.0;
    }
  }
  else {
    pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->m_normals,(long)*piStack_20);
    dVar1 = pvVar5->X;
    pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->m_normals,(long)k_local._4_4_);
    dVar2 = pvVar5->X;
    pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->m_normals,(long)k_local._4_4_);
    dVar3 = pvVar5->Y;
    pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->m_normals,(long)*piStack_20);
    local_30 = dVar1 * dVar2 + dVar3 * pvVar5->Y;
    if (0.0 < local_30) {
      pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                         (&this->m_srcPoly,(long)k_local._4_4_);
      lVar4 = pvVar6->X;
      pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
               operator[](&this->m_normals,(long)*piStack_20);
      cVar7 = Round(pvVar5->X * this->m_delta + (double)lVar4);
      pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                         (&this->m_srcPoly,(long)k_local._4_4_);
      lVar4 = pvVar6->Y;
      pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
               operator[](&this->m_normals,(long)*piStack_20);
      cVar8 = Round(pvVar5->Y * this->m_delta + (double)lVar4);
      IntPoint::IntPoint(&local_40,cVar7,cVar8);
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                (&this->m_destPoly,&local_40);
      return;
    }
  }
  if (0.0 <= this->m_sinA * this->m_delta) {
    if (cosA._4_4_ == jtSquare) {
      DoSquare(this,k_local._4_4_,*piStack_20);
    }
    else if (cosA._4_4_ == jtRound) {
      DoRound(this,k_local._4_4_,*piStack_20);
    }
    else if (cosA._4_4_ == jtMiter) {
      pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
               operator[](&this->m_normals,(long)k_local._4_4_);
      dVar1 = pvVar5->X;
      pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
               operator[](&this->m_normals,(long)*piStack_20);
      dVar2 = pvVar5->X;
      pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
               operator[](&this->m_normals,(long)k_local._4_4_);
      dVar3 = pvVar5->Y;
      pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
               operator[](&this->m_normals,(long)*piStack_20);
      dVar1 = dVar1 * dVar2 + dVar3 * pvVar5->Y + 1.0;
      if (dVar1 < this->m_miterLim) {
        DoSquare(this,k_local._4_4_,*piStack_20);
      }
      else {
        DoMiter(this,k_local._4_4_,*piStack_20,dVar1);
      }
    }
  }
  else {
    pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (&this->m_srcPoly,(long)k_local._4_4_);
    lVar4 = pvVar6->X;
    pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->m_normals,(long)*piStack_20);
    cVar7 = Round(pvVar5->X * this->m_delta + (double)lVar4);
    pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (&this->m_srcPoly,(long)k_local._4_4_);
    lVar4 = pvVar6->Y;
    pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->m_normals,(long)*piStack_20);
    cVar8 = Round(pvVar5->Y * this->m_delta + (double)lVar4);
    IntPoint::IntPoint(&local_50,cVar7,cVar8);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
              (&this->m_destPoly,&local_50);
    pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (&this->m_srcPoly,(long)k_local._4_4_);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
              (&this->m_destPoly,pvVar6);
    pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (&this->m_srcPoly,(long)k_local._4_4_);
    lVar4 = pvVar6->X;
    pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->m_normals,(long)k_local._4_4_);
    cVar7 = Round(pvVar5->X * this->m_delta + (double)lVar4);
    pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (&this->m_srcPoly,(long)k_local._4_4_);
    lVar4 = pvVar6->Y;
    pvVar5 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->m_normals,(long)k_local._4_4_);
    cVar8 = Round(pvVar5->Y * this->m_delta + (double)lVar4);
    IntPoint::IntPoint((IntPoint *)&r,cVar7,cVar8);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
              (&this->m_destPoly,(value_type *)&r);
  }
  *piStack_20 = k_local._4_4_;
  return;
}

Assistant:

void ClipperOffset::OffsetPoint(int j, int& k, JoinType jointype)
{
  //cross product ...
  m_sinA = (m_normals[k].X * m_normals[j].Y - m_normals[j].X * m_normals[k].Y);
  if (std::fabs(m_sinA * m_delta) < 1.0) 
  {
    //dot product ...
    double cosA = (m_normals[k].X * m_normals[j].X + m_normals[j].Y * m_normals[k].Y ); 
    if (cosA > 0) // angle => 0 degrees
    {
      m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[k].X * m_delta),
        Round(m_srcPoly[j].Y + m_normals[k].Y * m_delta)));
      return; 
    }
    //else angle => 180 degrees   
  }
  else if (m_sinA > 1.0) m_sinA = 1.0;
  else if (m_sinA < -1.0) m_sinA = -1.0;

  if (m_sinA * m_delta < 0)
  {
    m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[k].X * m_delta),
      Round(m_srcPoly[j].Y + m_normals[k].Y * m_delta)));
    m_destPoly.push_back(m_srcPoly[j]);
    m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + m_normals[j].X * m_delta),
      Round(m_srcPoly[j].Y + m_normals[j].Y * m_delta)));
  }
  else
    switch (jointype)
    {
      case jtMiter:
        {
          double r = 1 + (m_normals[j].X * m_normals[k].X +
            m_normals[j].Y * m_normals[k].Y);
          if (r >= m_miterLim) DoMiter(j, k, r); else DoSquare(j, k);
          break;
        }
      case jtSquare: DoSquare(j, k); break;
      case jtRound: DoRound(j, k); break;
    }
  k = j;
}